

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,void *buffer,int stride,Res res)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  undefined2 uVar5;
  int iVar6;
  undefined4 extraout_var;
  void *pvVar8;
  long *plVar9;
  void *src;
  EVP_PKEY_CTX *pEVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 in_register_00000034;
  int iVar15;
  undefined6 in_register_00000082;
  int iVar16;
  int iVar17;
  void *local_70;
  long *plVar7;
  
  bVar2 = res.vlog2;
  bVar1 = res.ulog2;
  if (((-1 < faceid) && (this->_ok != false)) && ((uint)faceid < (this->_header).nfaces)) {
    uVar14 = this->_pixelsize << (bVar1 & 0x1f);
    if (stride == 0) {
      stride = uVar14;
    }
    iVar6 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                      (this,CONCAT44(in_register_00000034,faceid),
                       CONCAT62(in_register_00000082,res) & 0xffffffff);
    plVar7 = (long *)CONCAT44(extraout_var,iVar6);
    cVar4 = (**(code **)(*plVar7 + 0x18))(plVar7);
    if (cVar4 == '\0') {
      cVar4 = (**(code **)(*plVar7 + 0x38))(plVar7);
      if (cVar4 == '\0') {
        pEVar10 = (EVP_PKEY_CTX *)(**(code **)(*plVar7 + 0x30))(plVar7);
        PtexUtils::copy(pEVar10,(EVP_PKEY_CTX *)(ulong)uVar14);
      }
      else {
        uVar5 = (**(code **)(*plVar7 + 0x40))(plVar7);
        bVar3 = (byte)((ushort)uVar5 >> 8);
        bVar11 = (byte)uVar5;
        uVar14 = this->_pixelsize << (bVar11 & 0x1f);
        if ((int)(char)bVar2 - (int)(char)bVar3 != 0x1f) {
          iVar15 = 1 << ((byte)((int)(char)bVar2 - (int)(char)bVar3) & 0x1f);
          iVar6 = 1 << ((byte)((int)(char)bVar1 - (int)(char)bVar11) & 0x1f);
          if (iVar6 < 2) {
            iVar6 = 1;
          }
          if (iVar15 < 2) {
            iVar15 = 1;
          }
          iVar13 = 0 << (bVar3 & 0x1f);
          iVar16 = 0;
          local_70 = buffer;
          do {
            iVar12 = iVar16;
            if ((int)(char)bVar1 - (int)(char)bVar11 != 0x1f) {
              iVar12 = iVar6 + iVar16;
              pvVar8 = local_70;
              iVar17 = iVar6;
              do {
                plVar9 = (long *)(**(code **)(*plVar7 + 0x48))(plVar7,iVar16);
                cVar4 = (**(code **)(*plVar9 + 0x18))(plVar9);
                if (cVar4 == '\0') {
                  pEVar10 = (EVP_PKEY_CTX *)(**(code **)(*plVar9 + 0x30))(plVar9);
                  PtexUtils::copy(pEVar10,(EVP_PKEY_CTX *)(ulong)uVar14);
                }
                else {
                  src = (void *)(**(code **)(*plVar9 + 0x30))(plVar9);
                  PtexUtils::fill(src,pvVar8,stride,1 << (bVar11 & 0x1f),1 << (bVar3 & 0x1f),
                                  this->_pixelsize);
                }
                (**(code **)(*plVar9 + 0x10))(plVar9);
                pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar14);
                iVar16 = iVar16 + 1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            iVar16 = iVar12;
            local_70 = (void *)((long)local_70 + (long)(stride << (bVar3 & 0x1f)));
            iVar13 = iVar13 + 1;
          } while (iVar13 != iVar15);
        }
      }
    }
    else {
      pvVar8 = (void *)(**(code **)(*plVar7 + 0x30))(plVar7);
      PtexUtils::fill(pvVar8,buffer,stride,1 << (bVar1 & 0x1f),1 << (bVar2 & 0x1f),this->_pixelsize)
      ;
    }
    (**(code **)(*plVar7 + 0x10))(plVar7);
    return;
  }
  PtexUtils::fill((this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,buffer,stride,1 << (bVar1 & 0x1f),
                  1 << (bVar2 & 0x1f),this->_pixelsize);
  return;
}

Assistant:

void PtexReader::getData(int faceid, void* buffer, int stride, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        PtexUtils::fill(&_errorPixel[0], buffer, stride, res.u(), res.v(), _pixelsize);
        return;
    }

    // note - all locking is handled in called getData methods
    int resu = res.u(), resv = res.v();
    int rowlen = _pixelsize * resu;
    if (stride == 0) stride = rowlen;

    PtexPtr<PtexFaceData> d ( getData(faceid, res) );
    if (d->isConstant()) {
        // fill dest buffer with pixel value
        PtexUtils::fill(d->getData(), buffer, stride,
                        resu, resv, _pixelsize);
    }
    else if (d->isTiled()) {
        // loop over tiles
        Res tileres = d->tileRes();
        int ntilesu = res.ntilesu(tileres);
        int ntilesv = res.ntilesv(tileres);
        int tileures = tileres.u();
        int tilevres = tileres.v();
        int tilerowlen = _pixelsize * tileures;
        int tile = 0;
        char* dsttilerow = (char*) buffer;
        for (int i = 0; i < ntilesv; i++) {
            char* dsttile = dsttilerow;
            for (int j = 0; j < ntilesu; j++) {
                PtexPtr<PtexFaceData> t ( d->getTile(tile++) );
                if (t->isConstant())
                    PtexUtils::fill(t->getData(), dsttile, stride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(t->getData(), tilerowlen, dsttile, stride,
                                    tilevres, tilerowlen);
                dsttile += tilerowlen;
            }
            dsttilerow += stride * tilevres;
        }
    }
    else {
        PtexUtils::copy(d->getData(), rowlen, buffer, stride, resv, rowlen);
    }
}